

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O0

void __thiscall
slang::ast::CoverpointSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (CoverpointSymbol *this,CheckerMemberVisitor *visitor)

{
  bool bVar1;
  CheckerMemberVisitor *in_RDI;
  DeclaredType *unaff_retaddr;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  Expression *expr_1;
  Expression *expr;
  Expression *in_stack_ffffffffffffffc0;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  local_30;
  bool *local_28;
  Expression *local_20;
  Expression *local_18;
  
  local_18 = DeclaredType::getInitializer(unaff_retaddr);
  if (local_18 != (Expression *)0x0) {
    Expression::visit<slang::ast::CheckerMemberVisitor&>(in_stack_ffffffffffffffc0,in_RDI);
  }
  local_20 = getIffExpr(this);
  if (local_20 != (Expression *)0x0) {
    Expression::visit<slang::ast::CheckerMemberVisitor&>(in_stack_ffffffffffffffc0,in_RDI);
  }
  local_28 = &in_RDI[7].inAssignmentRhs;
  local_30._M_current =
       (CoverageOptionSetter *)
       std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)in_RDI);
  std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
         ::operator*(&local_30);
    CoverageOptionSetter::visitExprs<slang::ast::CheckerMemberVisitor&>
              ((CoverageOptionSetter *)in_stack_ffffffffffffffc0,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (auto expr = declaredType.getInitializer())
            expr->visit(visitor);

        if (auto expr = getIffExpr())
            expr->visit(visitor);

        for (auto& opt : options)
            opt.visitExprs(visitor);
    }